

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cDrawIndirectTests.cpp
# Opt level: O0

GLuint __thiscall
glcts::anon_unknown_0::DrawIndirectBase::CreateComputeProgram
          (DrawIndirectBase *this,string *cs,bool linkAndCheck)

{
  long lVar1;
  GLchar *local_38;
  char *src [1];
  GLuint sh;
  GLuint p;
  bool linkAndCheck_local;
  string *cs_local;
  DrawIndirectBase *this_local;
  
  this_local._4_4_ =
       glu::CallLogWrapper::glCreateProgram
                 (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper);
  src[0]._4_4_ = glu::CallLogWrapper::glCreateShader
                           (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,0x91b9);
  glu::CallLogWrapper::glAttachShader
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,this_local._4_4_,
             src[0]._4_4_);
  glu::CallLogWrapper::glDeleteShader
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,src[0]._4_4_);
  local_38 = (GLchar *)std::__cxx11::string::c_str();
  glu::CallLogWrapper::glShaderSource
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,src[0]._4_4_,1,
             &local_38,(GLint *)0x0);
  glu::CallLogWrapper::glCompileShader
            (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,src[0]._4_4_);
  if (linkAndCheck) {
    glu::CallLogWrapper::glLinkProgram
              (&(this->super_SubcaseBase).super_GLWrapper.super_CallLogWrapper,this_local._4_4_);
    lVar1 = CheckProgram(this,this_local._4_4_);
    if (lVar1 == 0) {
      this_local._4_4_ = 0;
    }
  }
  return this_local._4_4_;
}

Assistant:

GLuint CreateComputeProgram(const std::string& cs, bool linkAndCheck)
	{
		const GLuint p = glCreateProgram();

		const GLuint sh = glCreateShader(GL_COMPUTE_SHADER);
		glAttachShader(p, sh);
		glDeleteShader(sh);
		const char* const src[1] = { cs.c_str() };
		glShaderSource(sh, 1, src, NULL);
		glCompileShader(sh);

		if (linkAndCheck)
		{
			glLinkProgram(p);
			if (!CheckProgram(p))
			{
				return 0;
			}
		}

		return p;
	}